

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O2

void no_label::output_and_account_no_label_example(vw *all,example *ec)

{
  int *piVar1;
  size_t i;
  ulong uVar2;
  
  shared_data::update(all->sd,ec->test_only,false,ec->loss,ec->weight,ec->num_features);
  (*all->print)(all->raw_prediction,ec->partial_prediction,-1.0,ec->tag);
  for (uVar2 = 0; piVar1 = (all->final_prediction_sink)._begin,
      uVar2 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    (*all->print)(piVar1[uVar2],(ec->pred).scalar,0.0,ec->tag);
  }
  print_no_label_update(all,ec);
  return;
}

Assistant:

void output_and_account_no_label_example(vw& all, example& ec)
{
  all.sd->update(ec.test_only, false, ec.loss, ec.weight, ec.num_features);

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    all.print(f, ec.pred.scalar, 0, ec.tag);
  }

  print_no_label_update(all, ec);
}